

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

SNode * find_SNode(Parser *p,uint state,D_Scope *sc)

{
  SNode **ppSVar1;
  SNode *pSVar2;
  SNode *pSVar3;
  bool bVar4;
  
  ppSVar1 = (p->snode_hash).v;
  if (ppSVar1 == (SNode **)0x0) {
    pSVar2 = (SNode *)0x0;
  }
  else {
    pSVar2 = (SNode *)0x0;
    pSVar3 = ppSVar1[(ulong)(state * 0x1000 + (int)sc) % (ulong)(p->snode_hash).m];
    if (pSVar3 != (SNode *)0x0) {
      pSVar2 = (SNode *)0x0;
      do {
        if (((((long)pSVar3->state - (long)p->t->state >> 3) * -0x1111111111111111 - (ulong)state ==
              0) && (pSVar3->initial_scope == sc)) &&
           (bVar4 = pSVar2 != (SNode *)0x0, pSVar2 = pSVar3, bVar4)) {
          __assert_fail("!result",
                        "/workspace/llm4binary/github/license_c_cmakelists/jplevyak[P]dparser/parse.c"
                        ,0x98,"SNode *find_SNode(Parser *, uint, D_Scope *)");
        }
        pSVar3 = pSVar3->bucket_next;
      } while (pSVar3 != (SNode *)0x0);
    }
  }
  return pSVar2;
}

Assistant:

SNode *find_SNode(Parser *p, uint state, D_Scope *sc) {
  SNodeHash *ph = &p->snode_hash;
  SNode *sn;
  uint h = SNODE_HASH(state, sc);
  SNode *result = NULL;
  if (ph->v)
    for (sn = ph->v[h % ph->m]; sn; sn = sn->bucket_next)
      if (sn->state - p->t->state == state && sn->initial_scope == sc) {
        assert(!result);
        result = sn;
      }
  return result;
}